

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::ParseDirpathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  value_type vVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  long lVar4;
  long *plVar5;
  reference vector;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat *pUVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  UnifiedVectorFormat *pUVar13;
  VectorType VVar14;
  ValidityMask *in_R9;
  ulong uVar15;
  undefined8 *puVar16;
  UnifiedVectorFormat *pUVar17;
  bool bVar18;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  anon_struct_16_3_d7536bce_for_pointer aVar19;
  string_t sVar20;
  idx_t in_stack_fffffffffffffe28;
  UnifiedVectorFormat *idx;
  UnifiedVectorFormat ldata;
  undefined7 uStack_19f;
  long local_198;
  long local_190;
  Vector separator;
  anon_union_16_2_67f50693_for_value *local_138;
  ValidityMask local_130 [2];
  long *local_f0;
  long local_e8;
  long local_e0;
  Vector trim_extension;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  string_t::string_t((string_t *)&local_40.pointer,"default");
  duckdb::Value::Value((Value *)&trim_extension,(string_t)local_40);
  duckdb::Vector::Vector(&separator,(Value *)&trim_extension);
  duckdb::Value::~Value((Value *)&trim_extension);
  duckdb::Value::Value((Value *)&ldata,0);
  duckdb::Vector::Vector(&trim_extension,(Value *)&ldata);
  duckdb::Value::~Value((Value *)&ldata);
  ldata = (UnifiedVectorFormat)0x1;
  ReadOptionalArgs(args,&separator,&trim_extension,(bool *)&ldata);
  vVar2 = *vector;
  VVar14 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)separator ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar14);
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((local_130[0].super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((*local_130[0].super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)))) {
      aVar19 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          (string_t)local_138->pointer,in_R9,in_stack_fffffffffffffe28);
      paVar3->pointer = aVar19;
      goto LAB_0079dd12;
    }
  }
  else {
    idx = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)separator ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      if ((local_130[0].super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((*local_130[0].super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar12 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          lVar11 = 8;
          while (bVar18 = idx != (UnifiedVectorFormat *)0x0, idx = idx + -1, bVar18) {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar11);
            left_02.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar11);
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)local_138->pointer
                                ,in_R9,(idx_t)idx);
            *(long *)(lVar12 + -8 + lVar11) = sVar20.value._0_8_;
            *(long *)(lVar12 + lVar11) = sVar20.value._8_8_;
            lVar11 = lVar11 + 0x10;
          }
        }
        else {
          pUVar6 = idx + 0x3f;
          pUVar17 = (UnifiedVectorFormat *)0x0;
          for (uVar8 = 0; uVar8 != (ulong)pUVar6 >> 6; uVar8 = uVar8 + 1) {
            if (*(long *)(result + 0x28) == 0) {
              pUVar13 = pUVar17 + 0x40;
              if (idx <= pUVar17 + 0x40) {
                pUVar13 = idx;
              }
LAB_0079dc11:
              uVar9 = (long)pUVar17 << 4 | 8;
              for (; pUVar7 = pUVar17, pUVar17 < pUVar13; pUVar17 = pUVar17 + 1) {
                left.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
                left.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left,
                                    (string_t)local_138->pointer,in_R9,(idx_t)idx);
                *(long *)(lVar12 + -8 + uVar9) = sVar20.value._0_8_;
                *(long *)(lVar12 + uVar9) = sVar20.value._8_8_;
                uVar9 = uVar9 + 0x10;
              }
            }
            else {
              uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
              pUVar13 = pUVar17 + 0x40;
              if (idx <= pUVar17 + 0x40) {
                pUVar13 = idx;
              }
              if (uVar9 == 0xffffffffffffffff) goto LAB_0079dc11;
              pUVar7 = pUVar13;
              if (uVar9 != 0) {
                uVar10 = (long)pUVar17 << 4 | 8;
                for (uVar15 = 0; pUVar7 = pUVar17 + uVar15, pUVar17 + uVar15 < pUVar13;
                    uVar15 = uVar15 + 1) {
                  if ((uVar9 >> (uVar15 & 0x3f) & 1) != 0) {
                    left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar10);
                    left_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar10);
                    sVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_00,
                                        (string_t)local_138->pointer,in_R9,(idx_t)idx);
                    *(long *)(lVar12 + -8 + uVar10) = sVar20.value._0_8_;
                    *(long *)(lVar12 + uVar10) = sVar20.value._8_8_;
                  }
                  uVar10 = uVar10 + 0x10;
                }
              }
            }
            pUVar17 = pUVar7;
          }
        }
        goto LAB_0079dd12;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || separator != (Vector)0x0) {
        if (separator == (Vector)0x0 && vVar2 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          duckdb::Vector::SetVectorType(VVar14);
          lVar12 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(&separator);
          pVVar1 = result + 0x28;
          duckdb::ValidityMask::Combine((ValidityMask *)pVVar1,(ulong)local_130);
          if (*(long *)pVVar1 == 0) {
            lVar11 = 8;
            while (bVar18 = idx != (UnifiedVectorFormat *)0x0, idx = idx + -1, bVar18) {
              sVar20.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar11);
              sVar20.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar11);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + lVar11);
              right_06.value._0_8_ = *(undefined8 *)((long)local_138 + lVar11 + -8);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar20,right_06,in_R9,(idx_t)idx);
              *(long *)(lVar12 + -8 + lVar11) = sVar20.value._0_8_;
              *(long *)(lVar12 + lVar11) = sVar20.value._8_8_;
              lVar11 = lVar11 + 0x10;
            }
          }
          else {
            pUVar6 = idx + 0x3f;
            pUVar17 = (UnifiedVectorFormat *)0x0;
            for (uVar8 = 0; uVar8 != (ulong)pUVar6 >> 6; uVar8 = uVar8 + 1) {
              if (*(long *)pVVar1 == 0) {
                pUVar13 = pUVar17 + 0x40;
                if (idx <= pUVar17 + 0x40) {
                  pUVar13 = idx;
                }
LAB_0079e0c4:
                uVar9 = (long)pUVar17 << 4 | 8;
                for (; pUVar7 = pUVar17, pUVar17 < pUVar13; pUVar17 = pUVar17 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
                  left_03.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + uVar9);
                  right_02.value._0_8_ = *(undefined8 *)((long)local_138 + (uVar9 - 8));
                  sVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,
                                      (idx_t)idx);
                  *(long *)(lVar12 + -8 + uVar9) = sVar20.value._0_8_;
                  *(long *)(lVar12 + uVar9) = sVar20.value._8_8_;
                  uVar9 = uVar9 + 0x10;
                }
              }
              else {
                uVar9 = *(ulong *)(*(long *)pVVar1 + uVar8 * 8);
                pUVar13 = pUVar17 + 0x40;
                if (idx <= pUVar17 + 0x40) {
                  pUVar13 = idx;
                }
                if (uVar9 == 0xffffffffffffffff) goto LAB_0079e0c4;
                pUVar7 = pUVar13;
                if (uVar9 != 0) {
                  uVar15 = (long)pUVar17 << 4 | 8;
                  for (uVar10 = 0; pUVar7 = pUVar17 + uVar10, pUVar17 + uVar10 < pUVar13;
                      uVar10 = uVar10 + 1) {
                    if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar15);
                      left_04.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar15);
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + uVar15)
                      ;
                      right_03.value._0_8_ = *(undefined8 *)((long)local_138 + (uVar15 - 8));
                      sVar20 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                          (idx_t)idx);
                      *(long *)(lVar12 + -8 + uVar15) = sVar20.value._0_8_;
                      *(long *)(lVar12 + uVar15) = sVar20.value._8_8_;
                    }
                    uVar15 = uVar15 + 0x10;
                  }
                }
              }
              pUVar17 = pUVar7;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_f0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,idx);
          duckdb::Vector::ToUnifiedFormat((ulong)&separator,idx);
          duckdb::Vector::SetVectorType(VVar14);
          lVar4 = *(long *)(result + 0x20);
          plVar5 = (long *)CONCAT71(uStack_19f,ldata);
          FlatVector::VerifyFlatVector(result);
          if (local_e0 == 0 && local_190 == 0) {
            puVar16 = (undefined8 *)(lVar4 + 8);
            for (pUVar17 = (UnifiedVectorFormat *)0x0; idx != pUVar17; pUVar17 = pUVar17 + 1) {
              lVar4 = *plVar5;
              pUVar6 = pUVar17;
              if (lVar4 != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)pUVar17 * 4);
              }
              pUVar13 = pUVar17;
              if (*local_f0 != 0) {
                pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_f0 + (long)pUVar17 * 4);
              }
              left_01.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_198 + 8 + (long)pUVar6 * 0x10);
              left_01.value._0_8_ = *(undefined8 *)(local_198 + (long)pUVar6 * 0x10);
              right.value.pointer.ptr = (char *)*(undefined8 *)(local_e8 + 8 + (long)pUVar13 * 0x10)
              ;
              right.value._0_8_ = *(undefined8 *)(local_e8 + (long)pUVar13 * 0x10);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,(idx_t)idx);
              puVar16[-1] = sVar20.value._0_8_;
              *puVar16 = sVar20.value._8_8_;
              puVar16 = puVar16 + 2;
            }
          }
          else {
            puVar16 = (undefined8 *)(lVar4 + 8);
            for (pUVar17 = (UnifiedVectorFormat *)0x0; idx != pUVar17; pUVar17 = pUVar17 + 1) {
              lVar4 = *plVar5;
              pUVar6 = pUVar17;
              if (lVar4 != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)pUVar17 * 4);
              }
              pUVar13 = pUVar17;
              if (*local_f0 != 0) {
                pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_f0 + (long)pUVar17 * 4);
              }
              if (((local_190 == 0) ||
                  ((*(ulong *)(local_190 + ((ulong)pUVar6 >> 6) * 8) >> ((ulong)pUVar6 & 0x3f) & 1)
                   != 0)) &&
                 ((local_e0 == 0 ||
                  ((*(ulong *)(local_e0 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_198 + 8 + (long)pUVar6 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_198 + (long)pUVar6 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_e8 + 8 + (long)pUVar13 * 0x10);
                right_04.value._0_8_ = *(undefined8 *)(local_e8 + (long)pUVar13 * 0x10);
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    (idx_t)idx);
                puVar16[-1] = sVar20.value._0_8_;
                *puVar16 = sVar20.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar17);
              }
              puVar16 = puVar16 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_f0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_0079dd12;
      }
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar4 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(&separator);
        FlatVector::SetValidity(result,local_130);
        if (*(long *)(result + 0x28) == 0) {
          lVar12 = 8;
          while (bVar18 = idx != (UnifiedVectorFormat *)0x0, idx = idx + -1, bVar18) {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + lVar12);
            right_05.value._0_8_ = *(undefined8 *)((long)local_138 + lVar12 + -8);
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,right_05,
                                in_R9,(idx_t)idx);
            *(long *)(lVar4 + -8 + lVar12) = sVar20.value._0_8_;
            *(long *)(lVar4 + lVar12) = sVar20.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
        }
        else {
          pUVar6 = idx + 0x3f;
          pUVar17 = (UnifiedVectorFormat *)0x0;
          for (uVar8 = 0; uVar8 != (ulong)pUVar6 >> 6; uVar8 = uVar8 + 1) {
            if (*(long *)(result + 0x28) == 0) {
              pUVar13 = pUVar17 + 0x40;
              if (idx <= pUVar17 + 0x40) {
                pUVar13 = idx;
              }
LAB_0079dee6:
              uVar9 = (long)pUVar17 << 4 | 8;
              for (; pUVar7 = pUVar17, pUVar17 < pUVar13; pUVar17 = pUVar17 + 1) {
                right_00.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + uVar9);
                right_00.value._0_8_ = *(undefined8 *)((long)local_138 + (uVar9 - 8));
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                    right_00,in_R9,(idx_t)idx);
                *(long *)(lVar4 + -8 + uVar9) = sVar20.value._0_8_;
                *(long *)(lVar4 + uVar9) = sVar20.value._8_8_;
                uVar9 = uVar9 + 0x10;
              }
            }
            else {
              uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
              pUVar13 = pUVar17 + 0x40;
              if (idx <= pUVar17 + 0x40) {
                pUVar13 = idx;
              }
              if (uVar9 == 0xffffffffffffffff) goto LAB_0079dee6;
              pUVar7 = pUVar13;
              if (uVar9 != 0) {
                uVar10 = (long)pUVar17 << 4 | 8;
                for (uVar15 = 0; pUVar7 = pUVar17 + uVar15, pUVar17 + uVar15 < pUVar13;
                    uVar15 = uVar15 + 1) {
                  if ((uVar9 >> (uVar15 & 0x3f) & 1) != 0) {
                    right_01.value.pointer.ptr = (char *)*(undefined8 *)((long)local_138 + uVar10);
                    right_01.value._0_8_ = *(undefined8 *)((long)local_138 + (uVar10 - 8));
                    sVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                        right_01,in_R9,(idx_t)idx);
                    *(long *)(lVar4 + -8 + uVar10) = sVar20.value._0_8_;
                    *(long *)(lVar4 + uVar10) = sVar20.value._8_8_;
                  }
                  uVar10 = uVar10 + 0x10;
                }
              }
            }
            pUVar17 = pUVar7;
          }
        }
        goto LAB_0079dd12;
      }
    }
    duckdb::Vector::SetVectorType(VVar14);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_0079dd12:
  Vector::~Vector(&trim_extension);
  Vector::~Vector(&separator);
  return;
}

Assistant:

static void ParseDirpathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(false);
	ReadOptionalArgs(args, separator, trim_extension, true);

	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    path, separator, result, args.size(), [&](string_t input_path, string_t input_sep) {
		    auto path = input_path.GetData();
		    auto path_size = input_path.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    auto last_sep = FindLast(path, path_size, sep);
		    if (last_sep == 0 && path_size == 1) {
			    last_sep = 1;
		    }
		    idx_t new_size = (IsIdxValid(last_sep, path_size)) ? last_sep : 0;

		    auto target = StringVector::EmptyString(result, new_size);
		    auto output = target.GetDataWriteable();
		    memcpy(output, path, new_size);
		    target.Finalize();
		    return StringVector::AddString(result, target);
	    });
}